

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::setEnabled(QAction *this,bool b)

{
  byte b_00;
  QActionPrivate *pQVar1;
  QCoreApplication *pQVar2;
  byte in_SIL;
  QActionPrivate *in_RDI;
  long in_FS_OFFSET;
  QActionPrivate *d;
  char *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  b_00 = in_SIL & 1;
  pQVar1 = d_func((QAction *)0x976c0e);
  if (((*(ushort *)&pQVar1->field_0x188 >> 2 & 1) != (ushort)(b_00 & 1)) ||
     ((*(ushort *)&pQVar1->field_0x188 >> 1 & 1) == 0)) {
    *(ushort *)&pQVar1->field_0x188 =
         *(ushort *)&pQVar1->field_0x188 & 0xfffb | (ushort)(b_00 & 1) << 2;
    *(ushort *)&pQVar1->field_0x188 = *(ushort *)&pQVar1->field_0x188 & 0xfffd | 2;
    pQVar2 = QCoreApplication::instance();
    if (pQVar2 == (QCoreApplication *)0x0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,
                 (char *)CONCAT17(b_00,CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)
                                 ),(int)((ulong)pQVar1 >> 0x20),in_stack_ffffffffffffffb8);
      QMessageLogger::warning
                (local_28,"QAction: Initialize Q(Gui)Application before calling \'setEnabled\'.");
    }
    else {
      QActionPrivate::setEnabled(in_RDI,(bool)b_00,(bool)in_stack_ffffffffffffffce);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAction::setEnabled(bool b)
{
    Q_D(QAction);
    if (d->explicitEnabledValue == b && d->explicitEnabled)
        return;
    d->explicitEnabledValue = b;
    d->explicitEnabled = true;
    QAPP_CHECK("setEnabled");
    d->setEnabled(b, false);
}